

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::bt_peer_connection::on_hash_reject(bt_peer_connection *this,int received)

{
  _Atomic_word *p_Var1;
  crypto_receive_buffer *this_00;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  hash_request *phVar4;
  pointer phVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  char *pcVar8;
  __normal_iterator<libtorrent::aux::hash_request_*,_std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>_>
  _Var9;
  pointer phVar10;
  long lVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *this_02;
  span<const_char> sVar12;
  hash_request hr;
  sha256_hash file_root;
  
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  iVar7 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[7])(this);
  if ((*(byte *)(CONCAT44(extraout_var,iVar7) + 0x1f) & 1) == 0) {
    file_root.m_number._M_elems._0_16_ = errors::make_error_code(invalid_message);
  }
  else {
    this_00 = &this->m_recv_buffer;
    iVar7 = crypto_receive_buffer::packet_size(this_00);
    if (iVar7 == 0x31) {
      bVar6 = crypto_receive_buffer::packet_finished(this_00);
      if (!bVar6) {
        return;
      }
      this_02 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var3 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
               super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      this_01 = p_Var3;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
        }
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar7 = p_Var3->_M_use_count;
          do {
            this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (iVar7 == 0) break;
            LOCK();
            iVar2 = p_Var3->_M_use_count;
            bVar6 = iVar7 == iVar2;
            if (bVar6) {
              p_Var3->_M_use_count = iVar7 + 1;
              iVar2 = iVar7;
            }
            iVar7 = iVar2;
            UNLOCK();
            this_01 = p_Var3;
          } while (!bVar6);
        }
      }
      if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        this_02 = (torrent *)0x0;
      }
      else if (this_01->_M_use_count == 0) {
        this_02 = (torrent *)0x0;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &p_Var3->_M_weak_count;
          iVar7 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar7 = p_Var3->_M_weak_count;
          p_Var3->_M_weak_count = iVar7 + -1;
        }
        if (iVar7 == 1) {
          (*p_Var3->_vptr__Sp_counted_base[3])();
        }
      }
      sVar12 = crypto_receive_buffer::get(this_00);
      pcVar8 = sVar12.m_ptr;
      file_root.m_number._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar8 + 1);
      file_root.m_number._M_elems._16_8_ = *(undefined8 *)(pcVar8 + 0x11);
      file_root.m_number._M_elems._24_8_ = *(undefined8 *)(pcVar8 + 0x19);
      hr.file = file_storage::file_index_for_root
                          (&((this_02->super_torrent_hot_members).m_torrent_file.
                             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_files,&file_root);
      lVar11 = 0;
      hr.base = 0;
      do {
        hr.base = (uint)(byte)pcVar8[lVar11 + 0x21] | hr.base << 8;
        lVar11 = lVar11 + 1;
      } while ((int)lVar11 != 4);
      lVar11 = 0;
      hr.index = 0;
      do {
        hr.index = (uint)(byte)pcVar8[lVar11 + 0x25] | hr.index << 8;
        lVar11 = lVar11 + 1;
      } while ((int)lVar11 != 4);
      lVar11 = 0;
      hr.count = 0;
      do {
        hr.count = (uint)(byte)pcVar8[lVar11 + 0x29] | hr.count << 8;
        lVar11 = lVar11 + 1;
      } while ((int)lVar11 != 4);
      lVar11 = 0;
      hr.proof_layers = 0;
      do {
        hr.proof_layers = (uint)(byte)pcVar8[lVar11 + 0x2d] | hr.proof_layers << 8;
        lVar11 = lVar11 + 1;
      } while ((int)lVar11 != 4);
      bVar6 = peer_connection::should_log(&this->super_peer_connection,incoming_message);
      if (bVar6) {
        peer_connection::peer_log
                  (&this->super_peer_connection,incoming_message,"HASH_REJECT",
                   "file: %d base: %d idx: %d cnt: %d proofs: %d",(ulong)(uint)hr.file.m_val,
                   (ulong)(uint)hr.base,(ulong)(uint)hr.index,(ulong)(uint)hr.count,
                   (ulong)(uint)hr.proof_layers);
      }
      _Var9 = ::std::
              __remove_if<__gnu_cxx::__normal_iterator<libtorrent::aux::hash_request*,std::vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::hash_request_const>>
                        ((this->m_hash_requests).
                         super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->m_hash_requests).
                         super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&hr);
      phVar4 = (this->m_hash_requests).
               super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (_Var9._M_current != phVar4) {
        phVar5 = (this->m_hash_requests).
                 super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        phVar10 = (pointer)((long)_Var9._M_current + ((long)phVar5 - (long)phVar4));
        if (phVar5 != phVar10) {
          (this->m_hash_requests).
          super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
          ._M_impl.super__Vector_impl_data._M_finish = phVar10;
        }
        torrent::hashes_rejected(this_02,&hr);
        maybe_send_hash_request(this);
      }
      if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      return;
    }
    file_root.m_number._M_elems._0_16_ = errors::make_error_code(invalid_hash_reject);
  }
  (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
            (this,&file_root,1,2);
  return;
}

Assistant:

void bt_peer_connection::on_hash_reject(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);
		received_bytes(0, received);

		if (!peer_info_struct()->protocol_v2)
		{
			disconnect(errors::invalid_message, operation_t::bittorrent, peer_error);
			return;
		}

		if (m_recv_buffer.packet_size() != 1 + 32 + 4 + 4 + 4 + 4)
		{
			disconnect(errors::invalid_hash_reject, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}
		if (!m_recv_buffer.packet_finished()) return;

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		span<char const> recv_buffer = m_recv_buffer.get();
		const char* ptr = recv_buffer.begin() + 1;

		auto const file_root = sha256_hash(ptr);
		file_index_t const file_index = t->torrent_file().files().file_index_for_root(file_root);
		ptr += sha256_hash::size();
		int const base = aux::read_int32(ptr);
		int const index = aux::read_int32(ptr);
		int const count = aux::read_int32(ptr);
		int const proof_layers = aux::read_int32(ptr);
		hash_request hr(file_index, base, index, count, proof_layers);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::incoming_message))
		{
			peer_log(peer_log_alert::incoming_message, "HASH_REJECT"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, static_cast<int>(hr.file), hr.base, hr.index, hr.count, hr.proof_layers);
		}
#endif

		auto new_end = std::remove(m_hash_requests.begin(), m_hash_requests.end(), hr);
		if (new_end == m_hash_requests.end()) return;
		m_hash_requests.erase(new_end, m_hash_requests.end());

		t->hashes_rejected(hr);

		maybe_send_hash_request();
	}